

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ErrorTest_ErrorToString_DefaultErrorShouldReturnOkAsString_Test::TestBody
          (ErrorTest_ErrorToString_DefaultErrorShouldReturnOkAsString_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80 [3];
  string local_68;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  Error error;
  ErrorTest_ErrorToString_DefaultErrorShouldReturnOkAsString_Test *this_local;
  
  Error::Error((Error *)&gtest_ar.message_);
  Error::ToString_abi_cxx11_(&local_68,(Error *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_48,"error.ToString()","\"OK\"",&local_68,(char (*) [3])0x33f63b);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x38,message);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Error::~Error((Error *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ErrorTest, ErrorToString_DefaultErrorShouldReturnOkAsString)
{
    Error error;

    EXPECT_EQ(error.ToString(), "OK");
}